

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

bool rest_block(any *context,HTTPRequest *req,string *strURIPart,TxVerbosity tx_verbosity)

{
  string_view str;
  span<unsigned_char,_18446744073709551615UL> __sp;
  Span<const_unsigned_char> sp;
  string_view reply;
  string_view reply_00;
  Span<const_unsigned_char> s;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  bool bVar1;
  TxVerbosity TVar2;
  ChainstateManager *pCVar3;
  BlockManager *this;
  CBlockIndex *block_00;
  CBlockIndex *pos_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_CBlock> PVar4;
  ChainstateManager *chainman;
  ChainstateManager *maybe_chainman;
  CBlockIndex *tip;
  CBlockIndex *pblockindex;
  RESTResponseFormat rf;
  DataStream block_stream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_data;
  FlatFilePos pos;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  string strJSON;
  UniValue objBlock;
  CBlock block;
  string strHex;
  optional<uint256> hash;
  string hashStr;
  ChainstateManager *in_stack_fffffffffffffa28;
  undefined6 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa36;
  undefined1 in_stack_fffffffffffffa37;
  string *in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa40;
  int in_stack_fffffffffffffa44;
  int iVar5;
  undefined4 in_stack_fffffffffffffa48;
  int in_stack_fffffffffffffa4c;
  pointer in_stack_fffffffffffffa50;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffa58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  any *in_stack_fffffffffffffa68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string *in_stack_fffffffffffffa80;
  undefined8 in_stack_fffffffffffffa88;
  HTTPStatusCode status;
  HTTPRequest *in_stack_fffffffffffffa90;
  string *in_stack_fffffffffffffa98;
  string *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffab4;
  size_t in_stack_fffffffffffffab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  TxVerbosity verbosity;
  undefined1 in_stack_fffffffffffffb58 [16];
  undefined1 in_stack_fffffffffffffb68 [16];
  bool local_40b;
  undefined1 local_40a [2];
  ParamsWrapper<TransactionSerParams,_CBlock> local_408;
  undefined1 local_3c2 [40];
  allocator<char> local_39a;
  allocator<char> local_399;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  FlatFilePos local_378;
  FlatFilePos local_370;
  UniValue local_2b8 [7];
  long local_8;
  
  status = (HTTPStatusCode)((ulong)in_stack_fffffffffffffa88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CheckWarmup((HTTPRequest *)in_stack_fffffffffffffa60);
  if (bVar1) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
    TVar2 = ParseDataFormat(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    verbosity = TVar2;
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    str._M_len._4_4_ = in_stack_fffffffffffffa44;
    str._M_len._0_4_ = in_stack_fffffffffffffa40;
    str._M_str._0_4_ = in_stack_fffffffffffffa48;
    str._M_str._4_4_ = in_stack_fffffffffffffa4c;
    uint256::FromHex(str);
    bVar1 = std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_fffffffffffffa28);
    if (bVar1) {
      local_370.nFile = 0;
      local_370.nPos = 0;
      FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffffa28);
      pCVar3 = GetChainman(in_stack_fffffffffffffa68,(HTTPRequest *)in_stack_fffffffffffffa60);
      if (pCVar3 == (ChainstateManager *)0x0) {
        local_40b = false;
      }
      else {
        MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                  ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffa28);
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffa68,
                   (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffa60,
                   (char *)in_stack_fffffffffffffa58._M_extent_value,
                   (char *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
                   SUB41((uint)in_stack_fffffffffffffa48 >> 0x18,0));
        this = (BlockManager *)ChainstateManager::ActiveChain(in_stack_fffffffffffffa28);
        block_00 = CChain::Tip((CChain *)in_stack_fffffffffffffa38);
        std::optional<uint256>::operator*((optional<uint256> *)in_stack_fffffffffffffa28);
        pos_00 = node::BlockManager::LookupBlockIndex
                           ((BlockManager *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                            (uint256 *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40)
                           );
        if (pos_00 == (CBlockIndex *)0x0) {
          std::operator+(in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58._M_extent_value
                        );
          local_40b = RESTERR(in_stack_fffffffffffffa90,status,in_stack_fffffffffffffa80);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa28);
          bVar1 = true;
        }
        else if ((pos_00->nStatus & 8) == 0) {
          bVar1 = node::BlockManager::IsBlockPruned
                            ((BlockManager *)
                             CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                             (CBlockIndex *)
                             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
          if (bVar1) {
            std::operator+(in_stack_fffffffffffffa60,
                           (char *)in_stack_fffffffffffffa58._M_extent_value);
            local_40b = RESTERR(in_stack_fffffffffffffa90,status,in_stack_fffffffffffffa80);
            in_stack_fffffffffffffaef = local_40b;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa28);
            bVar1 = true;
          }
          else {
            in_stack_fffffffffffffae0 = in_RSI;
            std::operator+(in_stack_fffffffffffffa60,
                           (char *)in_stack_fffffffffffffa58._M_extent_value);
            local_40b = RESTERR(in_stack_fffffffffffffa90,status,in_stack_fffffffffffffa80);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa28);
            bVar1 = true;
          }
        }
        else {
          local_378 = CBlockIndex::GetBlockPos
                                ((CBlockIndex *)
                                 CONCAT17(in_stack_fffffffffffffa37,
                                          CONCAT16(in_stack_fffffffffffffa36,
                                                   in_stack_fffffffffffffa30)));
          bVar1 = false;
          local_370 = local_378;
        }
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffa28);
        if (!bVar1) {
          local_398 = 0;
          uStack_390 = 0;
          local_388 = 0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffa28);
          bVar1 = node::BlockManager::ReadRawBlockFromDisk
                            (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)block_00,
                             (FlatFilePos *)pos_00);
          if (bVar1) {
            if (TVar2 == SHOW_DETAILS) {
              iVar5 = (int)((ulong)&local_399 >> 0x20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
                         (allocator<char> *)in_stack_fffffffffffffa68);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
                         (allocator<char> *)in_stack_fffffffffffffa68);
              HTTPRequest::WriteHeader
                        ((HTTPRequest *)
                         CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                         (string *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                         in_stack_fffffffffffffa38);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              std::allocator<char>::~allocator(&local_39a);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              std::allocator<char>::~allocator(&local_399);
              std::span<unsigned_char,_18446744073709551615UL>::
              span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                        ((span<unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffa38,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_fffffffffffffa37,
                                  CONCAT16(in_stack_fffffffffffffa36,in_stack_fffffffffffffa30)));
              __sp._M_extent._M_extent_value = in_stack_fffffffffffffa58._M_extent_value;
              __sp._M_ptr = in_stack_fffffffffffffa50;
              std::as_bytes<unsigned_char,_18446744073709551615UL>(__sp);
              reply_01._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffffae8;
              reply_01._M_ptr = (pointer)in_stack_fffffffffffffae0;
              reply_01._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffffaef;
              HTTPRequest::WriteReply
                        ((HTTPRequest *)CONCAT44(in_stack_fffffffffffffab4,TVar2),iVar5,reply_01);
              local_40b = true;
            }
            else if (TVar2 == SHOW_DETAILS_AND_PREVOUT) {
              Span<unsigned_char_const>::
              Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((Span<const_unsigned_char> *)in_stack_fffffffffffffa38,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_fffffffffffffa37,
                                  CONCAT16(in_stack_fffffffffffffa36,in_stack_fffffffffffffa30)),
                         in_stack_fffffffffffffa28);
              s.m_data._4_4_ = in_stack_fffffffffffffab4;
              s.m_data._0_4_ = TVar2;
              s.m_size = in_stack_fffffffffffffab8;
              HexStr_abi_cxx11_(s);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                             (char *)in_stack_fffffffffffffa38);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
                         (allocator<char> *)in_stack_fffffffffffffa68);
              pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3c2;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (pbVar6,(char *)in_stack_fffffffffffffa70,
                         (allocator<char> *)in_stack_fffffffffffffa68);
              HTTPRequest::WriteHeader
                        ((HTTPRequest *)
                         CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                         (string *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                         in_stack_fffffffffffffa38);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              std::allocator<char>::~allocator((allocator<char> *)local_3c2);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              std::allocator<char>::~allocator((allocator<char> *)(local_3c2 + 1));
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
              reply._M_str = (char *)in_stack_fffffffffffffa68;
              reply._M_len = (size_t)in_stack_fffffffffffffa60;
              HTTPRequest::WriteReply
                        ((HTTPRequest *)
                         CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                         in_stack_fffffffffffffa44,reply);
              local_40b = true;
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
            }
            else if (TVar2 == (SHOW_DETAILS_AND_PREVOUT|SHOW_DETAILS)) {
              CBlock::CBlock((CBlock *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48)
                            );
              Span<unsigned_char_const>::
              Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((Span<const_unsigned_char> *)in_stack_fffffffffffffa38,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_fffffffffffffa37,
                                  CONCAT16(in_stack_fffffffffffffa36,in_stack_fffffffffffffa30)),
                         in_stack_fffffffffffffa28);
              sp.m_size = in_stack_fffffffffffffa58._M_extent_value;
              sp.m_data = in_stack_fffffffffffffa50;
              DataStream::DataStream((DataStream *)in_stack_fffffffffffffa38,sp);
              PVar4 = TransactionSerParams::operator()
                                ((TransactionSerParams *)in_stack_fffffffffffffa38,
                                 (CBlock *)
                                 CONCAT17(in_stack_fffffffffffffa37,
                                          CONCAT16(in_stack_fffffffffffffa36,
                                                   in_stack_fffffffffffffa30)));
              local_408 = PVar4;
              DataStream::operator>>
                        ((DataStream *)in_stack_fffffffffffffa38,
                         (ParamsWrapper<TransactionSerParams,_CBlock> *)
                         CONCAT17(in_stack_fffffffffffffa37,
                                  CONCAT16(in_stack_fffffffffffffa36,in_stack_fffffffffffffa30)));
              blockToJSON(in_stack_fffffffffffffb68._8_8_,in_stack_fffffffffffffb68._0_8_,
                          in_stack_fffffffffffffb58._8_8_,in_stack_fffffffffffffb58._0_8_,verbosity)
              ;
              UniValue::write_abi_cxx11_(local_2b8,(int)local_2b8 + 0x40,(void *)0x0,0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                             (char *)in_stack_fffffffffffffa38);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
                         (allocator<char> *)PVar4.m_params);
              pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_40a;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
                         (allocator<char> *)PVar4.m_params);
              HTTPRequest::WriteHeader
                        ((HTTPRequest *)pbVar6,
                         (string *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                         in_stack_fffffffffffffa38);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              std::allocator<char>::~allocator((allocator<char> *)local_40a);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              std::allocator<char>::~allocator((allocator<char> *)(local_40a + 1));
              iVar5 = (int)((ulong)in_RSI >> 0x20);
              std::__cxx11::string::operator_cast_to_basic_string_view(pbVar6);
              reply_00._M_str = &(PVar4.m_params)->allow_witness;
              reply_00._M_len = (size_t)PVar4.m_object;
              HTTPRequest::WriteReply((HTTPRequest *)pbVar6,iVar5,reply_00);
              local_40b = true;
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa28);
              DataStream::~DataStream((DataStream *)in_stack_fffffffffffffa28);
              CBlock::~CBlock((CBlock *)in_stack_fffffffffffffa28);
            }
            else {
              AvailableDataFormatsString_abi_cxx11_();
              std::operator+((char *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                             in_RSI);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                             (char *)in_RSI);
              local_40b = RESTERR(in_stack_fffffffffffffa90,status,in_stack_fffffffffffffa80);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa28);
              in_stack_fffffffffffffa38 = in_RSI;
            }
          }
          else {
            std::operator+(in_stack_fffffffffffffa60,
                           (char *)in_stack_fffffffffffffa58._M_extent_value);
            local_40b = RESTERR(in_stack_fffffffffffffa90,status,in_stack_fffffffffffffa80);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa28);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffa38);
        }
      }
    }
    else {
      std::operator+((char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
      local_40b = RESTERR(in_stack_fffffffffffffa90,status,in_stack_fffffffffffffa80);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa28);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa28);
  }
  else {
    local_40b = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_40b & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_block(const std::any& context,
                       HTTPRequest* req,
                       const std::string& strURIPart,
                       TxVerbosity tx_verbosity)
{
    if (!CheckWarmup(req))
        return false;
    std::string hashStr;
    const RESTResponseFormat rf = ParseDataFormat(hashStr, strURIPart);

    auto hash{uint256::FromHex(hashStr)};
    if (!hash) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + hashStr);
    }

    FlatFilePos pos{};
    const CBlockIndex* pblockindex = nullptr;
    const CBlockIndex* tip = nullptr;
    ChainstateManager* maybe_chainman = GetChainman(context, req);
    if (!maybe_chainman) return false;
    ChainstateManager& chainman = *maybe_chainman;
    {
        LOCK(cs_main);
        tip = chainman.ActiveChain().Tip();
        pblockindex = chainman.m_blockman.LookupBlockIndex(*hash);
        if (!pblockindex) {
            return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not found");
        }
        if (!(pblockindex->nStatus & BLOCK_HAVE_DATA)) {
            if (chainman.m_blockman.IsBlockPruned(*pblockindex)) {
                return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not available (pruned data)");
            }
            return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not available (not fully downloaded)");
        }
        pos = pblockindex->GetBlockPos();
    }

    std::vector<uint8_t> block_data{};
    if (!chainman.m_blockman.ReadRawBlockFromDisk(block_data, pos)) {
        return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not found");
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, std::as_bytes(std::span{block_data}));
        return true;
    }

    case RESTResponseFormat::HEX: {
        const std::string strHex{HexStr(block_data) + "\n"};
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }

    case RESTResponseFormat::JSON: {
        CBlock block{};
        DataStream block_stream{block_data};
        block_stream >> TX_WITH_WITNESS(block);
        UniValue objBlock = blockToJSON(chainman.m_blockman, block, *tip, *pblockindex, tx_verbosity);
        std::string strJSON = objBlock.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }

    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}